

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

bool __thiscall
DependencyScan::RecomputeOutputsDirty
          (DependencyScan *this,Edge *edge,Node *most_recent_input,bool *outputs_dirty,string *err)

{
  bool bVar1;
  reference ppNVar2;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_68;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_60;
  iterator o;
  string command;
  string *err_local;
  bool *outputs_dirty_local;
  Node *most_recent_input_local;
  Edge *edge_local;
  DependencyScan *this_local;
  
  Edge::EvaluateCommand_abi_cxx11_((string *)&o,edge,true);
  local_60._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&edge->outputs_);
  do {
    local_68._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&edge->outputs_);
    bVar1 = __gnu_cxx::operator!=(&local_60,&local_68);
    if (!bVar1) {
LAB_00131ff2:
      std::__cxx11::string::~string((string *)&o);
      return true;
    }
    ppNVar2 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_60);
    bVar1 = RecomputeOutputDirty(this,edge,most_recent_input,(string *)&o,*ppNVar2);
    if (bVar1) {
      *outputs_dirty = true;
      goto LAB_00131ff2;
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&local_60);
  } while( true );
}

Assistant:

bool DependencyScan::RecomputeOutputsDirty(Edge* edge, Node* most_recent_input,
                                           bool* outputs_dirty, string* err) {
  string command = edge->EvaluateCommand(/*incl_rsp_file=*/true);
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (RecomputeOutputDirty(edge, most_recent_input, command, *o)) {
      *outputs_dirty = true;
      return true;
    }
  }
  return true;
}